

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

void __thiscall QSocks5SocketEnginePrivate::sendRequestMethod(QSocks5SocketEnginePrivate *this)

{
  quint16 port;
  qsizetype qVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  long in_FS_OFFSET;
  QHostAddress address;
  QByteArray local_88;
  QHostAddress local_70;
  QArrayData *local_68;
  ushort *local_60;
  undefined8 local_58;
  ushort local_4a;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_70);
  if (this->mode == ConnectMode) {
    lVar5 = 0xc0;
    lVar3 = 0xb8;
  }
  else {
    lVar5 = 0xb0;
    lVar3 = 0xa8;
  }
  QHostAddress::operator=
            (&local_70,
             (QHostAddress *)
             (&(this->super_QAbstractSocketEnginePrivate).super_QObjectPrivate + lVar3));
  port = *(quint16 *)(&(this->super_QAbstractSocketEnginePrivate).super_QObjectPrivate + lVar5);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char *)0x0;
  local_88.d.size = 0;
  QByteArray::reallocData((longlong)&local_88,0x10e);
  if ((&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) &&
     (*(qsizetype *)((long)local_88.d.d + 8) != 0)) {
    *(byte *)&(((ArrayOptions *)((long)local_88.d.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_88.d.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  cVar4 = (char)&local_88;
  QByteArray::append(cVar4);
  QByteArray::append(cVar4);
  QByteArray::append(cVar4);
  if (((this->peerName).d.size != 0) ||
     (bVar2 = qt_socks5_set_host_address_and_port(&local_70,port,&local_88), bVar2)) {
    if ((this->peerName).d.size != 0) {
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QUrl::toAce(&local_48,&this->peerName,0);
      qVar1 = local_48.d.size;
      if ((ulong)local_48.d.size < (undefined1 *)0x100) {
        QByteArray::append(cVar4);
        QByteArray::append(cVar4);
        QByteArray::append(&local_88);
        local_4a = port << 8 | port >> 8;
        local_60 = &local_4a;
        local_68 = (QArrayData *)0x0;
        local_58 = 2;
        QByteArray::append(&local_88);
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,1,0x10);
          }
        }
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((undefined1 *)0xff < (ulong)qVar1) goto LAB_0023d14e;
    }
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char *)0x0;
    local_48.d.size = 0;
    QByteArray::operator=(&local_48,&local_88);
    QIODevice::write((QByteArray *)this->data->controlSocket);
    QAbstractSocket::flush(&this->data->controlSocket->super_QAbstractSocket);
    this->socks5State = RequestMethodSent;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
LAB_0023d14e:
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  QHostAddress::~QHostAddress(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::sendRequestMethod()
{
    QHostAddress address;
    quint16 port = 0;
    char command = 0;
    if (mode == ConnectMode) {
        command = S5_CONNECT;
        address = peerAddress;
        port = peerPort;
    } else if (mode == BindMode) {
        command = S5_BIND;
        address = localAddress;
        port = localPort;
    } else {
#ifndef QT_NO_UDPSOCKET
        command = S5_UDP_ASSOCIATE;
        address = localAddress; //data->controlSocket->localAddress();
        port = localPort;
#endif
    }

    QByteArray buf;
    buf.reserve(270); // big enough for domain name;
    buf.append(char(S5_VERSION_5));
    buf.append(command);
    buf.append('\0');
    if (peerName.isEmpty() && !qt_socks5_set_host_address_and_port(address, port, &buf)) {
        QSOCKS5_DEBUG << "error setting address" << address << " : " << port;
        //### set error code ....
        return;
    } else if (!peerName.isEmpty() && !qt_socks5_set_host_name_and_port(peerName, port, &buf)) {
        QSOCKS5_DEBUG << "error setting peer name" << peerName << " : " << port;
        //### set error code ....
        return;
    }
    QSOCKS5_DEBUG << "sending" << dump(buf);
    QByteArray sealedBuf;
    if (!data->authenticator->seal(buf, &sealedBuf)) {
        // ### Handle this error.
    }
    data->controlSocket->write(sealedBuf);
    data->controlSocket->flush();
    socks5State = RequestMethodSent;
}